

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int deflateSetDictionary(z_streamp strm,Bytef *dictionary,uInt dictLength)

{
  uInt uVar1;
  uint uVar2;
  deflate_state *s;
  Posf *pPVar3;
  Bytef *pBVar4;
  Bytef *pBVar5;
  Posf *pPVar6;
  int iVar7;
  int iVar8;
  uLong uVar9;
  uint uVar10;
  uInt uVar11;
  ulong uVar12;
  uInt uVar13;
  uInt uVar14;
  
  iVar7 = deflateStateCheck(strm);
  iVar8 = -2;
  if ((dictionary != (Bytef *)0x0) && (iVar7 == 0)) {
    s = strm->state;
    iVar7 = s->wrap;
    if ((iVar7 != 2) && (((iVar7 != 1 || (s->status == 0x2a)) && (s->lookahead == 0)))) {
      if (iVar7 == 1) {
        uVar9 = adler32(strm->adler,dictionary,dictLength);
        strm->adler = uVar9;
      }
      s->wrap = 0;
      uVar13 = dictLength;
      if (s->w_size <= dictLength) {
        if (iVar7 == 0) {
          pPVar3 = s->head;
          uVar12 = (ulong)(s->hash_size - 1);
          pPVar3[uVar12] = 0;
          memset(pPVar3,0,uVar12 * 2);
          s->strstart = 0;
          s->block_start = 0;
          s->insert = 0;
        }
        uVar13 = s->w_size;
        dictionary = dictionary + (dictLength - uVar13);
      }
      uVar1 = strm->avail_in;
      pBVar4 = strm->next_in;
      strm->avail_in = uVar13;
      strm->next_in = dictionary;
      fill_window(s);
      uVar13 = s->lookahead;
      while (2 < uVar13) {
        uVar11 = s->strstart;
        iVar8 = uVar13 - 2;
        uVar13 = s->hash_shift;
        pBVar5 = s->window;
        uVar10 = s->hash_mask;
        pPVar3 = s->head;
        pPVar6 = s->prev;
        uVar2 = s->w_mask;
        uVar14 = s->ins_h;
        do {
          uVar14 = ((uint)pBVar5[uVar11 + 2] ^ uVar14 << ((byte)uVar13 & 0x1f)) & uVar10;
          s->ins_h = uVar14;
          pPVar6[uVar2 & uVar11] = pPVar3[uVar14];
          pPVar3[uVar14] = (Posf)uVar11;
          uVar11 = uVar11 + 1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        s->strstart = uVar11;
        s->lookahead = 2;
        fill_window(s);
        uVar13 = s->lookahead;
      }
      uVar10 = s->strstart + uVar13;
      s->strstart = uVar10;
      s->block_start = (ulong)uVar10;
      s->insert = uVar13;
      s->lookahead = 0;
      s->prev_length = 2;
      s->match_length = 2;
      s->match_available = 0;
      strm->next_in = pBVar4;
      strm->avail_in = uVar1;
      s->wrap = iVar7;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int ZEXPORT deflateSetDictionary (strm, dictionary, dictLength)
    z_streamp strm;
    const Bytef *dictionary;
    uInt  dictLength;
{
    deflate_state *s;
    uInt str, n;
    int wrap;
    unsigned avail;
    z_const unsigned char *next;

    if (deflateStateCheck(strm) || dictionary == Z_NULL)
        return Z_STREAM_ERROR;
    s = strm->state;
    wrap = s->wrap;
    if (wrap == 2 || (wrap == 1 && s->status != INIT_STATE) || s->lookahead)
        return Z_STREAM_ERROR;

    /* when using zlib wrappers, compute Adler-32 for provided dictionary */
    if (wrap == 1)
        strm->adler = adler32(strm->adler, dictionary, dictLength);
    s->wrap = 0;                    /* avoid computing Adler-32 in read_buf */

    /* if dictionary would fill window, just replace the history */
    if (dictLength >= s->w_size) {
        if (wrap == 0) {            /* already empty otherwise */
            CLEAR_HASH(s);
            s->strstart = 0;
            s->block_start = 0L;
            s->insert = 0;
        }
        dictionary += dictLength - s->w_size;  /* use the tail */
        dictLength = s->w_size;
    }

    /* insert dictionary into window and hash */
    avail = strm->avail_in;
    next = strm->next_in;
    strm->avail_in = dictLength;
    strm->next_in = (z_const Bytef *)dictionary;
    fill_window(s);
    while (s->lookahead >= MIN_MATCH) {
        str = s->strstart;
        n = s->lookahead - (MIN_MATCH-1);
        do {
            UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
            s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
            s->head[s->ins_h] = (Pos)str;
            str++;
        } while (--n);
        s->strstart = str;
        s->lookahead = MIN_MATCH-1;
        fill_window(s);
    }
    s->strstart += s->lookahead;
    s->block_start = (long)s->strstart;
    s->insert = s->lookahead;
    s->lookahead = 0;
    s->match_length = s->prev_length = MIN_MATCH-1;
    s->match_available = 0;
    strm->next_in = next;
    strm->avail_in = avail;
    s->wrap = wrap;
    return Z_OK;
}